

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::ByteSizeLong
          (BayesianProbitRegressor_Gaussian *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(-(uint)(this->mean_ != 0.0) & 1);
  sVar1 = uVar3 * 9 + 9;
  sVar2 = uVar3 * 9;
  if (this->precision_ != 0.0) {
    sVar2 = sVar1;
  }
  if (NAN(this->precision_)) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t BayesianProbitRegressor_Gaussian::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  size_t total_size = 0;

  // double mean = 1;
  if (this->mean() != 0) {
    total_size += 1 + 8;
  }

  // double precision = 2;
  if (this->precision() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}